

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long lVar10;
  ulong uVar11;
  float *pfVar12;
  uint uVar13;
  int iVar14;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  ulong uVar15;
  
  if (*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]) != 1.0) {
    iVar14 = bottom_top_blob->dims;
    auVar17 = ZEXT416((uint)*(float *)(&this->field_0xd0 + (long)this->_vptr_Dropout_x86_avx[-3]));
    if (bottom_top_blob->elempack == 4) {
      uVar2 = bottom_top_blob->w;
      uVar3 = bottom_top_blob->h;
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      fVar16 = auVar17._0_4_;
      fVar18 = auVar17._4_4_;
      fVar19 = auVar17._8_4_;
      fVar20 = auVar17._12_4_;
      if (iVar14 == 3) {
        uVar13 = bottom_top_blob->c;
        if (0 < (int)uVar13) {
          uVar11 = 0;
          do {
            if (0 < (int)(uVar3 * uVar2)) {
              pfVar12 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar14 = uVar3 * uVar2;
              do {
                *pfVar12 = fVar16 * *pfVar12;
                pfVar12[1] = fVar18 * pfVar12[1];
                pfVar12[2] = fVar19 * pfVar12[2];
                pfVar12[3] = fVar20 * pfVar12[3];
                pfVar12 = pfVar12 + 4;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else if (iVar14 == 2) {
        if (0 < (int)uVar3) {
          uVar11 = 0;
          do {
            if (0 < (int)uVar2) {
              pfVar12 = (float *)((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar15 = (ulong)uVar2;
              do {
                *pfVar12 = fVar16 * *pfVar12;
                pfVar12[1] = fVar18 * pfVar12[1];
                pfVar12[2] = fVar19 * pfVar12[2];
                pfVar12[3] = fVar20 * pfVar12[3];
                pfVar12 = pfVar12 + 4;
                uVar13 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar13;
              } while (uVar13 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar3);
        }
      }
      else if ((iVar14 == 1) && (0 < (int)uVar2)) {
        lVar10 = 0;
        do {
          pfVar12 = (float *)((long)bottom_top_blob->data + lVar10);
          fVar4 = pfVar12[1];
          fVar5 = pfVar12[2];
          fVar6 = pfVar12[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar10);
          *pfVar1 = fVar16 * *pfVar12;
          pfVar1[1] = fVar18 * fVar4;
          pfVar1[2] = fVar19 * fVar5;
          pfVar1[3] = fVar20 * fVar6;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar10);
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        iVar14 = Dropout::forward_inplace
                           ((Dropout *)
                            ((long)&this->_vptr_Dropout_x86_avx +
                            (long)this->_vptr_Dropout_x86_avx[-3]),bottom_top_blob,opt);
        return iVar14;
      }
      uVar2 = bottom_top_blob->w;
      uVar3 = bottom_top_blob->h;
      auVar17 = vshufps_avx(auVar17,auVar17,0);
      fVar16 = auVar17._0_4_;
      fVar18 = auVar17._4_4_;
      fVar19 = auVar17._8_4_;
      fVar20 = auVar17._12_4_;
      if (iVar14 == 3) {
        uVar13 = bottom_top_blob->c;
        if (0 < (int)uVar13) {
          uVar11 = 0;
          do {
            if (0 < (int)(uVar3 * uVar2)) {
              pfVar12 = (float *)(bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar14 = uVar3 * uVar2;
              do {
                *pfVar12 = fVar16 * *pfVar12;
                pfVar12[1] = fVar18 * pfVar12[1];
                pfVar12[2] = fVar19 * pfVar12[2];
                pfVar12[3] = fVar20 * pfVar12[3];
                pfVar12[4] = fVar16 * pfVar12[4];
                pfVar12[5] = fVar18 * pfVar12[5];
                pfVar12[6] = fVar19 * pfVar12[6];
                pfVar12[7] = 0.0;
                pfVar12 = pfVar12 + 8;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar13);
        }
      }
      else if (iVar14 == 2) {
        if (0 < (int)uVar3) {
          uVar11 = 0;
          do {
            if (0 < (int)uVar2) {
              pfVar12 = (float *)((long)bottom_top_blob->w * uVar11 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar15 = (ulong)uVar2;
              do {
                *pfVar12 = fVar16 * *pfVar12;
                pfVar12[1] = fVar18 * pfVar12[1];
                pfVar12[2] = fVar19 * pfVar12[2];
                pfVar12[3] = fVar20 * pfVar12[3];
                pfVar12[4] = fVar16 * pfVar12[4];
                pfVar12[5] = fVar18 * pfVar12[5];
                pfVar12[6] = fVar19 * pfVar12[6];
                pfVar12[7] = 0.0;
                pfVar12 = pfVar12 + 8;
                uVar13 = (int)uVar15 - 1;
                uVar15 = (ulong)uVar13;
              } while (uVar13 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar3);
        }
      }
      else if ((iVar14 == 1) && (0 < (int)uVar2)) {
        lVar10 = 0;
        do {
          pfVar12 = (float *)((long)bottom_top_blob->data + lVar10);
          fVar4 = pfVar12[1];
          fVar5 = pfVar12[2];
          fVar6 = pfVar12[3];
          fVar7 = pfVar12[4];
          fVar8 = pfVar12[5];
          fVar9 = pfVar12[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar10);
          *pfVar1 = fVar16 * *pfVar12;
          pfVar1[1] = fVar18 * fVar4;
          pfVar1[2] = fVar19 * fVar5;
          pfVar1[3] = fVar20 * fVar6;
          pfVar1[4] = fVar16 * fVar7;
          pfVar1[5] = fVar18 * fVar8;
          pfVar1[6] = fVar19 * fVar9;
          pfVar1[7] = 0.0;
          lVar10 = lVar10 + 0x20;
        } while ((ulong)uVar2 << 5 != lVar10);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}